

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O0

activationType PyreNet::ActivationFactory::fromString(string *activation)

{
  bool bVar1;
  exception *this;
  string *activation_local;
  
  bVar1 = std::operator==(activation,"step");
  if (bVar1) {
    activation_local._4_4_ = step;
  }
  else {
    bVar1 = std::operator==(activation,"linear");
    if (bVar1) {
      activation_local._4_4_ = linear;
    }
    else {
      bVar1 = std::operator==(activation,"tanh");
      if (bVar1) {
        activation_local._4_4_ = tanh;
      }
      else {
        bVar1 = std::operator==(activation,"sigmoid");
        if (bVar1) {
          activation_local._4_4_ = sigmoid;
        }
        else {
          bVar1 = std::operator==(activation,"relu");
          if (!bVar1) {
            this = (exception *)__cxa_allocate_exception(8);
            std::exception::exception(this);
            __cxa_throw(this,&std::exception::typeinfo,std::exception::~exception);
          }
          activation_local._4_4_ = relu;
        }
      }
    }
  }
  return activation_local._4_4_;
}

Assistant:

LayerDefinition::activationType ActivationFactory::fromString(const std::string& activation) {
        if (activation == "step") {
            return LayerDefinition::step;
        } else if (activation == "linear") {
            return LayerDefinition::linear;
        } else if (activation == "tanh") {
            return LayerDefinition::tanh;
        } else if (activation == "sigmoid") {
            return LayerDefinition::sigmoid;
        } else if (activation == "relu") {
            return LayerDefinition::relu;
        } else {
            throw std::exception();
        }
    }